

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProxyLine.cpp
# Opt level: O1

void __thiscall ProxyLine::onRead(ProxyLine *this)

{
  String *this_00;
  usize *puVar1;
  ICallback *pIVar2;
  usize uVar3;
  int iVar4;
  ssize_t sVar5;
  char *pcVar6;
  char *pcVar7;
  time_t tVar8;
  Client *this_01;
  usize postponed;
  usize size;
  byte buffer [262145];
  String SStack_40068;
  void *pvStack_40040;
  char acStack_40038 [262152];
  
  sVar5 = Server::Client::read
                    (this->_handle,(int)acStack_40038,(void *)0x40000,(size_t)&pvStack_40040);
  if ((char)sVar5 == '\0') {
    return;
  }
  if (this->_connected == true) {
    SStack_40068.data = (Data *)0x0;
    this_01 = this->_client;
    sVar5 = Server::Client::write(this_01,(int)acStack_40038,pvStack_40040,(size_t)&SStack_40068);
    if ((char)sVar5 == '\0') {
      return;
    }
    if (SStack_40068.data != (Data *)0x0) {
      this_01 = this->_handle;
      Server::Client::suspend(this_01);
    }
LAB_00108512:
    tVar8 = Time::time((time_t *)this_01);
    this->_lastReadActivity = tVar8;
  }
  else {
    acStack_40038[(long)pvStack_40040] = '\0';
    this_00 = &this->_proxyResponse;
    String::append(this_00,acStack_40038,(usize)pvStack_40040);
    pcVar6 = String::find(this_00,"\r\n\r\n");
    if (pcVar6 == (char *)0x0) {
      if (this_00->data->len < 0x101) {
        return;
      }
      SStack_40068.data = &SStack_40068._data;
      SStack_40068._data.ref = 0;
      SStack_40068._data.str = "Invalid HTTP reponse";
      SStack_40068._data.len = 0x14;
      (*this->_callback->_vptr_ICallback[1])(this->_callback,this,&SStack_40068);
    }
    else {
      SStack_40068.data = &SStack_40068._data;
      SStack_40068._data.ref = 0;
      SStack_40068._data.str = "HTTP/1.1 200 ";
      SStack_40068._data.len = 0xd;
      iVar4 = String::compare(this_00,&SStack_40068,0xd);
      if ((SStack_40068.data)->ref != 0) {
        LOCK();
        puVar1 = &(SStack_40068.data)->ref;
        *puVar1 = *puVar1 - 1;
        UNLOCK();
        if ((*puVar1 == 0) && (SStack_40068.data != (Data *)0x0)) {
          operator_delete__(SStack_40068.data);
        }
      }
      if (iVar4 == 0) {
        uVar3 = this_00->data->len;
        pcVar7 = String::operator_cast_to_char_(this_00);
        if (pcVar7 + (uVar3 - (long)(pcVar6 + 4)) != (char *)0x0) {
          Server::Client::write
                    (this->_client,(int)(pcVar6 + 4),pcVar7 + (uVar3 - (long)(pcVar6 + 4)),0);
        }
        SStack_40068.data = &String::emptyData.super_Data;
        String::operator=(this_00,&SStack_40068);
        if ((SStack_40068.data)->ref != 0) {
          LOCK();
          puVar1 = &(SStack_40068.data)->ref;
          *puVar1 = *puVar1 - 1;
          UNLOCK();
          if ((*puVar1 == 0) && (SStack_40068.data != (Data *)0x0)) {
            operator_delete__(SStack_40068.data);
          }
        }
        this->_connected = true;
        this_01 = (Client *)this->_callback;
        (*(code *)**(undefined8 **)this_01)(this_01,this);
        goto LAB_00108512;
      }
      pcVar6 = String::find(this_00,"\r\n");
      pIVar2 = this->_callback;
      pcVar7 = String::operator_cast_to_char_(this_00);
      String::substr(&SStack_40068,this_00,0,(long)pcVar6 - (long)pcVar7);
      (*pIVar2->_vptr_ICallback[1])(pIVar2,this,&SStack_40068);
    }
    if ((SStack_40068.data)->ref != 0) {
      LOCK();
      puVar1 = &(SStack_40068.data)->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (SStack_40068.data != (Data *)0x0)) {
        operator_delete__(SStack_40068.data);
      }
    }
  }
  return;
}

Assistant:

void ProxyLine::onRead()
{
    byte buffer[262144 + 1];
    usize size;
    if (!_handle->read(buffer, sizeof(buffer) - 1, size))
        return;
    if (_connected)
    {
        usize postponed = 0;
        if (!_client.write(buffer, size, &postponed))
            return;
        if (postponed)
            _handle->suspend();
        _lastReadActivity = Time::time();
    }
    else
    {
        buffer[size] = '\0';
        _proxyResponse.append((const char*)buffer, size);
        // expecting "HTTP/1.1 200 Connection established\r\n\r\n"
        const char* headerEnd = _proxyResponse.find("\r\n\r\n");
        if (headerEnd)
        {
            if (_proxyResponse.compare("HTTP/1.1 200 ", 13) == 0)
            {
                const char* bufferPos = headerEnd + 4;
                usize remainingSize = _proxyResponse.length() - (bufferPos - (const char*)_proxyResponse);
                if (remainingSize)
                    _client.write((const byte*)bufferPos, remainingSize);
                _proxyResponse = String();
                _connected = true;
                _callback.onOpened(*this);
                _lastReadActivity = Time::time();
            }
            else
            {
                const char* firstLineEnd = _proxyResponse.find("\r\n");
                _callback.onClosed(*this, _proxyResponse.substr(0, firstLineEnd - (const char*)_proxyResponse));
            }
        }
        else if (_proxyResponse.length() > 256)
            _callback.onClosed(*this, "Invalid HTTP reponse");
    }
}